

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

void encode_fixedarray(upb_encstate *e,upb_Array *arr,size_t elem_size,uint32_t tag)

{
  char *pcVar1;
  long lVar2;
  long lVar3;
  undefined8 *data;
  size_t len;
  void *data_00;
  size_t sStack_50;
  undefined4 local_44;
  ulong local_40;
  undefined8 local_38;
  
  len = arr->size_dont_copy_me__upb_internal_use_only * elem_size;
  data_00 = (void *)(arr->data_dont_copy_me__upb_internal_use_only & 0xfffffffffffffff8);
  if (tag == 0) {
    encode_bytes(e,data_00,len);
    return;
  }
  if ((elem_size != 8) && (elem_size != 4)) {
    __assert_fail("elem_size == 8",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/upb/wire/encode.c"
                  ,0xcc,
                  "void encode_fixedarray(upb_encstate *, const upb_Array *, size_t, uint32_t)");
  }
  local_40 = (ulong)tag;
  lVar2 = (arr->size_dont_copy_me__upb_internal_use_only - 1) * elem_size;
  lVar3 = 0;
  do {
    if (elem_size == 4) {
      local_44 = *(undefined4 *)((long)data_00 + lVar3 + lVar2);
      data = (undefined8 *)&local_44;
      sStack_50 = 4;
    }
    else {
      local_38 = *(undefined8 *)((long)data_00 + lVar3 + lVar2);
      data = &local_38;
      sStack_50 = 8;
    }
    encode_bytes(e,data,sStack_50);
    if ((tag < 0x80) && (pcVar1 = e->ptr, pcVar1 != e->buf)) {
      e->ptr = pcVar1 + -1;
      pcVar1[-1] = (char)tag;
    }
    else {
      encode_longvarint(e,local_40);
    }
    lVar3 = lVar3 - elem_size;
  } while (-lVar3 != len);
  return;
}

Assistant:

static void encode_fixedarray(upb_encstate* e, const upb_Array* arr,
                              size_t elem_size, uint32_t tag) {
  size_t bytes = upb_Array_Size(arr) * elem_size;
  const char* data = upb_Array_DataPtr(arr);
  const char* ptr = data + bytes - elem_size;

  if (tag || !upb_IsLittleEndian()) {
    while (true) {
      if (elem_size == 4) {
        uint32_t val;
        memcpy(&val, ptr, sizeof(val));
        val = upb_BigEndian32(val);
        encode_bytes(e, &val, elem_size);
      } else {
        UPB_ASSERT(elem_size == 8);
        uint64_t val;
        memcpy(&val, ptr, sizeof(val));
        val = upb_BigEndian64(val);
        encode_bytes(e, &val, elem_size);
      }

      if (tag) encode_varint(e, tag);
      if (ptr == data) break;
      ptr -= elem_size;
    }
  } else {
    encode_bytes(e, data, bytes);
  }
}